

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiPlatformMonitor *pIVar5;
  ImGuiPopupData *pIVar6;
  ImGuiDockNode *pIVar7;
  ImGuiDockNodeSettings *pIVar8;
  ImVec2 IVar9;
  double dVar10;
  undefined1 auVar11 [16];
  ImGuiContext *pIVar12;
  bool bVar13;
  int iVar14;
  ImGuiContext *g;
  undefined8 *puVar15;
  ImGuiWindowSettings *pIVar16;
  ImDrawList *pIVar17;
  ImGuiViewportP *pIVar18;
  ImGuiContext *g_3;
  void *ptr_id;
  char *pcVar19;
  ImGuiDockNode *pIVar20;
  char *pcVar21;
  long lVar22;
  ImGuiContext *pIVar23;
  ImGuiID IVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  int rect_n;
  long lVar28;
  ImGuiWindowSettings *pIVar29;
  ImGuiID IVar30;
  ulong uVar31;
  ImVector<ImDrawList_*> *pIVar32;
  long lVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined4 in_XMM4_Db;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  ImRect IVar37;
  ImVec2 pos;
  ImRect r;
  char *wrt_rects_names [7];
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  ImVec2 local_e0;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ImGuiContext *local_c8;
  ImVec2 local_c0;
  ImRect local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  ImVec2 local_70;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  bVar13 = Begin("Dear ImGui Metrics",p_open,0);
  pIVar23 = GImGui;
  if (!bVar13) {
    End();
    return;
  }
  local_38 = "ContentRegionRect";
  local_48 = "WorkRect";
  pcStack_40 = "Content";
  local_58 = "InnerRect";
  pcStack_50 = "InnerClipRect";
  local_68._0_4_ = 0x1a20dd;
  local_68._4_4_ = 0;
  uStack_60 = 0x1a20e7;
  uStack_5c = 0;
  if (GImGui != (ImGuiContext *)0x0) {
    Text("Dear ImGui %s","1.80 WIP");
    Text("Application average %.3f ms/frame (%.1f FPS)",
         SUB84((double)(1000.0 / (pIVar23->IO).Framerate),0));
    iVar14 = (pIVar23->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar23->IO).MetricsRenderVertices,
         (long)iVar14,(ulong)(uint)(iVar14 / 3));
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar23->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar23->IO).MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)(pIVar23->IO).MetricsActiveAllocations);
    Separator();
    bVar13 = TreeNode("Tools");
    if (bVar13) {
      auVar11._8_8_ = 0;
      auVar11._0_4_ = local_b8.Max.x;
      auVar11._4_4_ = local_b8.Max.y;
      local_b8 = (ImRect)(auVar11 << 0x40);
      bVar13 = Button("Item Picker..",&local_b8.Min);
      if (bVar13) {
        GImGui->DebugItemPickerActive = true;
      }
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar12->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x
        ;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
      Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar12->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x
        ;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      fVar34 = pIVar12->FontSize;
      *(byte *)&(pIVar12->NextItemData).Flags = (byte)(pIVar12->NextItemData).Flags | 1;
      (pIVar12->NextItemData).Width = fVar34 * 12.0;
      bVar13 = Combo("##show_windows_rect_type",&ShowMetricsWindow::show_windows_rect_type,
                     (char **)&local_68,7,7);
      ShowMetricsWindow::show_windows_rects = (bool)(ShowMetricsWindow::show_windows_rects | bVar13)
      ;
      if ((ShowMetricsWindow::show_windows_rects != false) &&
         (pIVar23->NavWindow != (ImGuiWindow *)0x0)) {
        lVar28 = 0;
        BulletText("\'%s\':",pIVar23->NavWindow->Name);
        pIVar12 = GImGui;
        pIVar4 = GImGui->CurrentWindow;
        pIVar4->WriteAccessed = true;
        fVar34 = (pIVar12->Style).IndentSpacing + (pIVar4->DC).Indent.x;
        (pIVar4->DC).Indent.x = fVar34;
        (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
        do {
          IVar37 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar23->NavWindow,(int)lVar28);
          in_XMM4_Dc = 0;
          in_XMM4_Dd = 0;
          dVar10 = (double)(IVar37.Max.x - IVar37.Min.x);
          in_XMM4_Db = (undefined4)((ulong)dVar10 >> 0x20);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar37.Min.x,0),
               (double)IVar37.Min.y,(double)IVar37.Max.x,(double)IVar37.Max.y,SUB84(dVar10,0),
               (double)(IVar37.Max.y - IVar37.Min.y),(&local_68)[lVar28]);
          pIVar12 = GImGui;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 7);
        pIVar4 = GImGui->CurrentWindow;
        pIVar4->WriteAccessed = true;
        fVar34 = (pIVar4->DC).Indent.x - (pIVar12->Style).IndentSpacing;
        (pIVar4->DC).Indent.x = fVar34;
        (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      }
      Checkbox("Show mesh when hovering ImDrawCmd",&ShowMetricsWindow::show_drawcmd_mesh);
      Checkbox("Show bounding boxes when hovering ImDrawCmd",&ShowMetricsWindow::show_drawcmd_aabb);
      TreePop();
    }
    local_d8 = &pIVar23->Windows;
    ShowMetricsWindow::Funcs::NodeWindows(local_d8,"Windows");
    bVar13 = TreeNode("Viewport","Viewports (%d)",(ulong)(uint)(pIVar23->Viewports).Size);
    if (bVar13) {
      fVar34 = GetTreeNodeToLabelSpacing();
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if ((fVar34 == 0.0) && (!NAN(fVar34))) {
        fVar34 = (pIVar12->Style).IndentSpacing;
      }
      fVar34 = fVar34 + (pIVar4->DC).Indent.x;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      ShowViewportThumbnails();
      fVar34 = GetTreeNodeToLabelSpacing();
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if ((fVar34 == 0.0) && (!NAN(fVar34))) {
        fVar34 = (pIVar12->Style).IndentSpacing;
      }
      fVar34 = (pIVar4->DC).Indent.x - fVar34;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      bVar13 = TreeNode("Monitors","Monitors (%d)",(ulong)(uint)(pIVar23->PlatformIO).Monitors.Size)
      ;
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar12->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x
        ;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      MetricsHelpMarker(
                       "Dear ImGui uses monitor data:\n- to query DPI settings on a per monitor basis\n- to position popup/tooltips so they don\'t straddle monitors."
                       );
      if (bVar13) {
        if (0 < (pIVar23->PlatformIO).Monitors.Size) {
          lVar28 = 0x20;
          uVar31 = 0;
          do {
            pIVar5 = (pIVar23->PlatformIO).Monitors.Data;
            fVar34 = *(float *)((long)pIVar5 + lVar28 + -0x20);
            fVar35 = *(float *)((long)pIVar5 + lVar28 + -0x1c);
            in_XMM4_Dc = 0;
            in_XMM4_Dd = 0;
            fVar36 = *(float *)((long)pIVar5 + lVar28 + -0x18);
            fVar1 = *(float *)((long)pIVar5 + lVar28 + -0x14);
            dVar10 = (double)(fVar35 + fVar1);
            in_XMM4_Db = (undefined4)((ulong)dVar10 >> 0x20);
            fVar2 = *(float *)((long)pIVar5 + lVar28 + -0x10);
            in_stack_fffffffffffffef8 = (char *)(double)*(float *)((long)pIVar5 + lVar28 + -0xc);
            in_stack_ffffffffffffff00 =
                 (char *)(double)(fVar2 + *(float *)((long)pIVar5 + lVar28 + -8));
            BulletText("Monitor #%d: DPI %.0f%%\n MainMin (%.0f,%.0f), MainMax (%.0f,%.0f), MainSize (%.0f,%.0f)\n WorkMin (%.0f,%.0f), WorkMax (%.0f,%.0f), WorkSize (%.0f,%.0f)"
                       ,SUB84((double)(*(float *)((long)&(pIVar5->MainPos).x + lVar28) * 100.0),0),
                       (double)fVar34,(double)fVar35,(double)(fVar34 + fVar36),SUB84(dVar10,0),
                       (double)fVar36,(double)fVar1,(double)fVar2,uVar31 & 0xffffffff);
            uVar31 = uVar31 + 1;
            lVar28 = lVar28 + 0x24;
          } while ((long)uVar31 < (long)(pIVar23->PlatformIO).Monitors.Size);
        }
        TreePop();
      }
      if (0 < (pIVar23->Viewports).Size) {
        lVar28 = 0;
        local_c8 = pIVar23;
        do {
          pIVar18 = (pIVar23->Viewports).Data[lVar28];
          SetNextItemOpen(true,2);
          ptr_id = (void *)(ulong)(pIVar18->super_ImGuiViewport).ID;
          bVar13 = TreeNode(ptr_id,"Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"",
                            (ulong)*(uint *)&(pIVar18->super_ImGuiViewport).field_0x64,ptr_id,
                            (ulong)(pIVar18->super_ImGuiViewport).ParentViewportId);
          if (bVar13) {
            uVar3 = (pIVar18->super_ImGuiViewport).Flags;
            in_XMM4_Dc = 0;
            in_XMM4_Dd = 0;
            dVar10 = (double)(pIVar18->super_ImGuiViewport).WorkOffsetMin.x;
            in_XMM4_Db = (undefined4)((ulong)dVar10 >> 0x20);
            BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%"
                       ,SUB84((double)(pIVar18->super_ImGuiViewport).Pos.x,0),
                       (double)(pIVar18->super_ImGuiViewport).Pos.y,
                       (double)(pIVar18->super_ImGuiViewport).Size.x,
                       (double)(pIVar18->super_ImGuiViewport).Size.y,SUB84(dVar10,0),
                       (double)(pIVar18->super_ImGuiViewport).WorkOffsetMin.y,
                       (double)(pIVar18->super_ImGuiViewport).WorkOffsetMax.x,
                       (double)(pIVar18->super_ImGuiViewport).WorkOffsetMax.y,
                       (ulong)(uint)(int)pIVar18->PlatformMonitor);
            pIVar23 = GImGui;
            if (0 < *(int *)&(pIVar18->super_ImGuiViewport).field_0x64) {
              pIVar4 = GImGui->CurrentWindow;
              pIVar4->WriteAccessed = true;
              if (pIVar4->SkipItems == false) {
                (pIVar4->DC).CursorPos.x =
                     (pIVar23->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x;
                (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
                (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
                (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
              }
              bVar13 = SmallButton("Reset Pos");
              if (bVar13) {
                (pIVar18->super_ImGuiViewport).Pos.x = 200.0;
                (pIVar18->super_ImGuiViewport).Pos.y = 200.0;
                pIVar4 = pIVar18->Window;
                if (pIVar4 != (ImGuiWindow *)0x0) {
                  (pIVar4->Pos).x = 200.0;
                  (pIVar4->Pos).y = 200.0;
                }
              }
            }
            pcVar21 = " CanHostOtherWindows";
            if ((uVar3 >> 9 & 1) == 0) {
              pcVar21 = "";
            }
            pcVar19 = " NoDecoration";
            if ((uVar3 & 1) == 0) {
              pcVar19 = "";
            }
            pcVar25 = " NoFocusOnAppearing";
            if ((uVar3 & 4) == 0) {
              pcVar25 = "";
            }
            pcVar26 = " NoInputs";
            if ((uVar3 & 0x10) == 0) {
              pcVar26 = "";
            }
            in_stack_fffffffffffffef8 = " NoRendererClear";
            if ((uVar3 & 0x20) == 0) {
              in_stack_fffffffffffffef8 = "";
            }
            in_stack_ffffffffffffff00 = " Minimized";
            if (-1 < (char)uVar3) {
              in_stack_ffffffffffffff00 = "";
            }
            pcVar27 = " NoAutoMerge";
            if ((uVar3 >> 8 & 1) == 0) {
              pcVar27 = "";
            }
            BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s",
                       (ulong)(uint)(pIVar18->super_ImGuiViewport).Flags,pcVar21,pcVar19,pcVar25,
                       pcVar26,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,pcVar27);
            lVar33 = 0;
            do {
              if (0 < (pIVar18->DrawDataBuilder).Layers[lVar33].Size) {
                pIVar32 = (pIVar18->DrawDataBuilder).Layers + lVar33;
                lVar22 = 0;
                do {
                  ShowMetricsWindow::Funcs::NodeDrawList
                            ((ImGuiWindow *)0x0,pIVar18,pIVar32->Data[lVar22],pcVar19);
                  lVar22 = lVar22 + 1;
                } while (lVar22 < pIVar32->Size);
              }
              bVar13 = lVar33 == 0;
              lVar33 = lVar33 + 1;
            } while (bVar13);
            TreePop();
            pIVar23 = local_c8;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < (pIVar23->Viewports).Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar23->OpenPopupStack).Size);
    if (bVar13) {
      if (0 < (pIVar23->OpenPopupStack).Size) {
        lVar33 = 8;
        lVar28 = 0;
        do {
          pIVar6 = (pIVar23->OpenPopupStack).Data;
          puVar15 = *(undefined8 **)((long)&pIVar6->PopupId + lVar33);
          pcVar21 = "NULL";
          if (puVar15 != (undefined8 *)0x0) {
            pcVar21 = (char *)*puVar15;
          }
          pcVar19 = "";
          if ((puVar15 != (undefined8 *)0x0) &&
             (pcVar19 = " ChildWindow", (*(byte *)((long)puVar15 + 0xf) & 1) == 0)) {
            pcVar19 = "";
          }
          pcVar25 = "";
          if ((puVar15 != (undefined8 *)0x0) &&
             (pcVar25 = " ChildMenu", (*(byte *)((long)puVar15 + 0xf) & 0x10) == 0)) {
            pcVar25 = "";
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar6 + lVar33 + -8),pcVar21,pcVar19,pcVar25);
          lVar28 = lVar28 + 1;
          lVar33 = lVar33 + 0x30;
        } while (lVar28 < (pIVar23->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar23->TabBars).Buf.Size);
    if (bVar13) {
      if (0 < (pIVar23->TabBars).Buf.Size) {
        lVar28 = 0;
        lVar33 = 0;
        do {
          ShowMetricsWindow::Funcs::NodeTabBar
                    ((ImGuiTabBar *)((long)&(((pIVar23->TabBars).Buf.Data)->Tabs).Size + lVar28));
          lVar33 = lVar33 + 1;
          lVar28 = lVar28 + 0x98;
        } while (lVar33 < (pIVar23->TabBars).Buf.Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("Dock nodes");
    if (bVar13) {
      Checkbox("List root nodes",&ShowMetricsWindow::root_nodes_only);
      Checkbox("Ctrl shows window dock info",&ShowMetricsWindow::show_docking_nodes);
      bVar13 = SmallButton("Clear nodes");
      if (bVar13) {
        DockContextClearNodes(pIVar23,0,true);
      }
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar12->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x
        ;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      bVar13 = SmallButton("Rebuild all");
      if (bVar13) {
        (pIVar23->DockContext).WantFullRebuild = true;
      }
      if (0 < (pIVar23->DockContext).Nodes.Data.Size) {
        lVar33 = 8;
        lVar28 = 0;
        do {
          pIVar7 = *(ImGuiDockNode **)
                    ((long)&((pIVar23->DockContext).Nodes.Data.Data)->key + lVar33);
          if ((pIVar7 != (ImGuiDockNode *)0x0) &&
             ((ShowMetricsWindow::root_nodes_only != true ||
              (pIVar7->ParentNode == (ImGuiDockNode *)0x0)))) {
            ShowMetricsWindow::Funcs::NodeDockNode(pIVar7,"Node");
          }
          lVar28 = lVar28 + 1;
          lVar33 = lVar33 + 0x10;
        } while (lVar28 < (pIVar23->DockContext).Nodes.Data.Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("Settings");
    if (bVar13) {
      bVar13 = SmallButton("Clear");
      if (bVar13) {
        ClearIniSettings();
      }
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar12->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x
        ;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      bVar13 = SmallButton("Save to memory");
      if (bVar13) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar12->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x
        ;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      bVar13 = SmallButton("Save to disk");
      if (bVar13) {
        SaveIniSettingsToDisk((pIVar23->IO).IniFilename);
      }
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar12->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x
        ;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      if ((pIVar23->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar23->SettingsDirtyTimer,0));
      bVar13 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                        (ulong)(uint)(pIVar23->SettingsHandlers).Size);
      if (bVar13) {
        if (0 < (pIVar23->SettingsHandlers).Size) {
          lVar33 = 0;
          lVar28 = 0;
          do {
            BulletText("%s",*(undefined8 *)
                             ((long)&((pIVar23->SettingsHandlers).Data)->TypeName + lVar33));
            lVar28 = lVar28 + 1;
            lVar33 = lVar33 + 0x48;
          } while (lVar28 < (pIVar23->SettingsHandlers).Size);
        }
        TreePop();
      }
      bVar13 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                        (ulong)(uint)(pIVar23->SettingsWindows).Buf.Size);
      if (bVar13) {
        pcVar21 = (pIVar23->SettingsWindows).Buf.Data;
        if (pcVar21 != (char *)0x0) {
          pIVar29 = (ImGuiWindowSettings *)(pcVar21 + 4);
          do {
            in_stack_ffffffffffffff00 =
                 (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                                  (uint)pIVar29->Collapsed);
            in_stack_fffffffffffffef8 =
                 (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                  (int)(pIVar29->Size).y);
            Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)pIVar29->ID,
                 pIVar29 + 1,(ulong)(uint)(int)(pIVar29->Pos).x,(ulong)(uint)(int)(pIVar29->Pos).y,
                 (ulong)(uint)(int)(pIVar29->Size).x,in_stack_fffffffffffffef8,
                 in_stack_ffffffffffffff00);
            pIVar29 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                                (&pIVar23->SettingsWindows,pIVar29);
          } while (pIVar29 != (ImGuiWindowSettings *)0x0);
        }
        TreePop();
      }
      bVar13 = TreeNode("SettingsDocking","Settings packed data: Docking");
      if (bVar13) {
        Text("In SettingsWindows:");
        pcVar21 = (pIVar23->SettingsWindows).Buf.Data;
        if (pcVar21 != (char *)0x0) {
          pIVar29 = (ImGuiWindowSettings *)(pcVar21 + 4);
          do {
            if (pIVar29->DockId != 0) {
              BulletText("Window \'%s\' -> DockId %08X",pIVar29 + 1);
            }
            pIVar29 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                                (&pIVar23->SettingsWindows,pIVar29);
          } while (pIVar29 != (ImGuiWindowSettings *)0x0);
        }
        Text("In SettingsNodes:");
        if (0 < (pIVar23->DockContext).NodesSettings.Size) {
          lVar33 = 0xc;
          lVar28 = 0;
          do {
            pIVar8 = (pIVar23->DockContext).NodesSettings.Data;
            IVar30 = *(ImGuiID *)((long)&pIVar8->ID + lVar33);
            if (IVar30 == 0) {
              pIVar29 = (ImGuiWindowSettings *)0x0;
            }
            else {
              puVar15 = (undefined8 *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,IVar30);
              if (puVar15 == (undefined8 *)0x0) {
                pIVar16 = FindWindowSettings(IVar30);
                pIVar29 = pIVar16 + 1;
                if (pIVar16 == (ImGuiWindowSettings *)0x0) {
                  pIVar29 = (ImGuiWindowSettings *)0x0;
                }
              }
              else {
                pIVar29 = (ImGuiWindowSettings *)*puVar15;
              }
            }
            uVar3 = *(uint *)((long)&pIVar8->ID + lVar33);
            pcVar21 = "";
            if (uVar3 != 0) {
              pcVar21 = "N/A";
            }
            if (pIVar29 != (ImGuiWindowSettings *)0x0) {
              pcVar21 = (char *)pIVar29;
            }
            BulletText("Node %08X, Parent %08X, SelectedTab %08X (\'%s\')",
                       (ulong)*(uint *)((long)pIVar8 + lVar33 + -0xc),
                       (ulong)*(uint *)((long)pIVar8 + lVar33 + -8),(ulong)uVar3,pcVar21);
            lVar28 = lVar28 + 1;
            lVar33 = lVar33 + 0x24;
          } while (lVar28 < (pIVar23->DockContext).NodesSettings.Size);
        }
        TreePop();
      }
      iVar14 = (pIVar23->SettingsIniData).Buf.Size;
      uVar31 = (ulong)(iVar14 - 1);
      if (iVar14 == 0) {
        uVar31 = 0;
      }
      bVar13 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar31);
      if (bVar13) {
        pcVar21 = (pIVar23->SettingsIniData).Buf.Data;
        pcVar19 = ImGuiTextBuffer::EmptyString;
        if (pcVar21 != (char *)0x0) {
          pcVar19 = pcVar21;
        }
        local_b8.Min.x = -1.1754944e-38;
        local_b8.Min.y = 0.0;
        InputTextMultiline("##Ini",pcVar19,(long)(pIVar23->SettingsIniData).Buf.Size,&local_b8.Min,
                           0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar13 = TreeNode("Internal state");
    if (bVar13) {
      Text("WINDOWING");
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      fVar34 = (pIVar12->Style).IndentSpacing + (pIVar4->DC).Indent.x;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      pcVar19 = "NULL";
      pcVar21 = "NULL";
      if (pIVar23->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar23->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar21);
      pcVar21 = "NULL";
      if (pIVar23->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar23->HoveredRootWindow->Name;
      }
      IVar30 = 0;
      Text("HoveredRootWindow: \'%s\'",pcVar21);
      if (pIVar23->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar19 = pIVar23->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar19);
      if (pIVar23->HoveredDockNode != (ImGuiDockNode *)0x0) {
        IVar30 = pIVar23->HoveredDockNode->ID;
      }
      IVar24 = 0;
      Text("HoveredDockNode: 0x%08X",(ulong)IVar30);
      if (pIVar23->MovingWindow == (ImGuiWindow *)0x0) {
        pcVar21 = "NULL";
      }
      else {
        pcVar21 = pIVar23->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar21);
      if (pIVar23->MouseLastHoveredViewport != (ImGuiViewportP *)0x0) {
        IVar24 = (pIVar23->MouseLastHoveredViewport->super_ImGuiViewport).ID;
      }
      Text("MouseViewport: 0x%08X (UserHovered 0x%08X, LastHovered 0x%08X)",
           (ulong)(pIVar23->MouseViewport->super_ImGuiViewport).ID,
           (ulong)(pIVar23->IO).MouseHoveredViewport,(ulong)IVar24);
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      fVar34 = (pIVar4->DC).Indent.x - (pIVar12->Style).IndentSpacing;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      Text("ITEMS");
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      fVar34 = (pIVar12->Style).IndentSpacing + (pIVar4->DC).Indent.x;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar23->ActiveIdTimer,0),(ulong)pIVar23->ActiveId,
           (ulong)pIVar23->ActiveIdPreviousFrame,(ulong)pIVar23->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001c5b50 + (ulong)pIVar23->ActiveIdSource * 8));
      pcVar19 = "NULL";
      pcVar21 = "NULL";
      if (pIVar23->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar23->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar21);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
           SUB84((double)pIVar23->HoveredIdTimer,0),(ulong)pIVar23->HoveredId,
           (ulong)pIVar23->HoveredIdPreviousFrame,(ulong)pIVar23->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar23->DragDropActive,(ulong)(pIVar23->DragDropPayload).SourceId,
           (pIVar23->DragDropPayload).DataType,(ulong)(uint)(pIVar23->DragDropPayload).DataSize);
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      fVar34 = (pIVar4->DC).Indent.x - (pIVar12->Style).IndentSpacing;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      Text("NAV,FOCUS");
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      fVar34 = (pIVar12->Style).IndentSpacing + (pIVar4->DC).Indent.x;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      pcVar21 = "NULL";
      if (pIVar23->NavWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar23->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar21);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar23->NavId,(ulong)pIVar23->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001c5b50 + (ulong)pIVar23->NavInputSource * 8))
      ;
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar23->IO).NavActive,
           (ulong)(pIVar23->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar23->NavActivateId,
           (ulong)pIVar23->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar23->NavDisableHighlight,
           (ulong)pIVar23->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar23->NavFocusScopeId);
      if (pIVar23->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar19 = pIVar23->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar19);
      pIVar12 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      fVar34 = (pIVar4->DC).Indent.x - (pIVar12->Style).IndentSpacing;
      (pIVar4->DC).Indent.x = fVar34;
      (pIVar4->DC).CursorPos.x = fVar34 + (pIVar4->Pos).x + (pIVar4->DC).ColumnsOffset.x;
      TreePop();
    }
    if (((ShowMetricsWindow::show_windows_rects != false) ||
        (ShowMetricsWindow::show_windows_begin_order == true)) && (0 < local_d8->Size)) {
      lVar28 = 0;
      do {
        pIVar4 = (pIVar23->Windows).Data[lVar28];
        if (pIVar4->WasActive == true) {
          pIVar17 = GetViewportDrawList(pIVar4->Viewport,1,"##Foreground");
          if (ShowMetricsWindow::show_windows_rects == true) {
            local_b8 = ShowMetricsWindow::Funcs::GetWindowRect
                                 (pIVar4,ShowMetricsWindow::show_windows_rect_type);
            ImDrawList::AddRect(pIVar17,&local_b8.Min,&local_b8.Max,0xff8000ff,0.0,0xf,1.0);
          }
          if ((ShowMetricsWindow::show_windows_begin_order == true) &&
             ((pIVar4->Flags & 0x1000000) == 0)) {
            ImFormatString((char *)&local_b8,0x20,"%d",
                           (ulong)(uint)(int)pIVar4->BeginOrderWithinContext);
            local_e0.x = (pIVar4->Pos).x + GImGui->FontSize;
            local_e0.y = GImGui->FontSize + (pIVar4->Pos).y;
            ImDrawList::AddRectFilled(pIVar17,&pIVar4->Pos,&local_e0,0xff6464c8,0.0,0xf);
            ImDrawList::AddText(pIVar17,&pIVar4->Pos,0xffffffff,(char *)&local_b8,(char *)0x0);
          }
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < local_d8->Size);
    }
    if (((ShowMetricsWindow::show_docking_nodes == true) && ((pIVar23->IO).KeyCtrl == true)) &&
       (pIVar7 = pIVar23->HoveredDockNode, pIVar7 != (ImGuiDockNode *)0x0)) {
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (ImRect)ZEXT816(0);
      if (pIVar7->HostWindow == (ImGuiWindow *)0x0) {
        pIVar18 = (ImGuiViewportP *)GetMainViewport();
      }
      else {
        pIVar18 = pIVar7->HostWindow->Viewport;
      }
      pIVar17 = GetViewportDrawList(pIVar18,1,"##Foreground");
      pcVar21 = " *CentralNode*";
      if (((uint)pIVar7->LocalFlags >> 0xb & 1) == 0) {
        pcVar21 = "";
      }
      iVar14 = ImFormatString((char *)&local_b8,0x40,"DockId: %X%s\n",(ulong)pIVar7->ID,pcVar21);
      pcVar21 = (char *)((long)&local_b8.Min.x + (long)iVar14);
      iVar14 = ImFormatString(pcVar21,0x40 - (long)iVar14,"WindowClass: %08X\n",
                              (ulong)(pIVar7->WindowClass).ClassId);
      pcVar21 = pcVar21 + iVar14;
      iVar14 = ImFormatString(pcVar21,(size_t)(local_78 + -(long)pcVar21),"Size: (%.0f, %.0f)\n",
                              SUB84((double)(pIVar7->Size).x,0),(double)(pIVar7->Size).y);
      ImFormatString(pcVar21 + iVar14,(size_t)(local_78 + -(long)(pcVar21 + iVar14)),
                     "SizeRef: (%.0f, %.0f)\n",SUB84((double)(pIVar7->SizeRef).x,0),
                     (double)(pIVar7->SizeRef).y);
      iVar14 = -1;
      pIVar20 = pIVar7;
      do {
        pIVar20 = pIVar20->ParentNode;
        iVar14 = iVar14 + 1;
      } while (pIVar20 != (ImGuiDockNode *)0x0);
      fVar36 = (float)iVar14 * 3.0;
      local_d8 = (ImVector<ImGuiWindow_*> *)CONCAT44(in_XMM4_Db,fVar36);
      fVar34 = (pIVar7->Pos).x;
      fVar35 = (pIVar7->Pos).y;
      local_e0.x = fVar36 + fVar34;
      local_e0.y = fVar36 + fVar35;
      local_c0.y = (fVar35 + (pIVar7->Size).y) - fVar36;
      local_c0.x = (fVar34 + (pIVar7->Size).x) - fVar36;
      uStack_d0 = in_XMM4_Dc;
      uStack_cc = in_XMM4_Dd;
      ImDrawList::AddRect(pIVar17,&local_e0,&local_c0,0xff6464c8,0.0,0xf,1.0);
      fVar34 = (pIVar7->Pos).x + (float)local_d8;
      fVar35 = (float)local_d8 + (pIVar7->Pos).y;
      local_e0.y = fVar35;
      local_e0.x = fVar34;
      local_c0.y = fVar35 + -1.0;
      local_c0.x = fVar34 + -1.0;
      IVar9 = ImFont::CalcTextSizeA
                        (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,(char *)&local_b8,
                         (char *)0x0,(char **)0x0);
      local_70.x = (float)(int)(IVar9.x + 0.95) + local_e0.x + 1.0;
      local_70.y = IVar9.y + local_e0.y + 1.0;
      ImDrawList::AddRectFilled(pIVar17,&local_c0,&local_70,0xff6464c8,0.0,0xf);
      ImDrawList::AddText(pIVar17,(ImFont *)0x0,0.0,&local_e0,0xffffffff,(char *)&local_b8,
                          (char *)0x0,0.0,(ImVec4 *)0x0);
    }
    End();
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0xd45,"ImGuiIO &ImGui::GetIO()");
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };

    // State
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_tables_rects = false;
    static int  show_tables_rect_type = TRT_WorkRect;
    static bool show_drawcmd_mesh = true;
    static bool show_drawcmd_aabb = true;
    static bool show_docking_nodes = false;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList()
    // - NodeColumns()
    // - NodeWindow()
    // - NodeWindows()
    // - NodeViewport()
    // - NodeDockNode()
    // - NodeTabBar()
    // - NodeStorage()
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawCmdShowMeshAndBoundingBox(ImDrawList* fg_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }

        // Note that both 'window' and 'viewport' may be NULL here. Viewport is generally null of destroyed popups which previously owned a viewport.
        static void NodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
            if (window && fg_draw_list && ImGui::IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper;
                clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
                    {
                        char* buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            ImGui::Text("(In front-to-back order:)");
            for (int i = windows.Size - 1; i >= 0; i--) // Iterate front to back
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }

            ImGuiContext& g = *GImGui;
            const bool is_active = window->WasActive;
            ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            const bool open = ImGui::TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
            if (!is_active) { PopStyleColor(); }
            if (ImGui::IsItemHovered() && is_active)
                ImGui::GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("WindowClassId: 0x%08X", window->WindowClass.ClassId);
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            ImGui::BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)", window->Viewport ? window->Viewport->Idx : -1, window->ViewportOwned ? " (Owned)" : "", window->ViewportId, window->ViewportPos.x, window->ViewportPos.y);
            ImGui::BulletText("ViewportMonitor: %d", window->Viewport ? window->Viewport->PlatformMonitor : -1);
            ImGui::BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d", window->DockId, window->DockOrder, window->DockIsActive, window->DockTabIsVisible);
            if (window->DockNode || window->DockNodeAsHost)
                NodeDockNode(window->DockNodeAsHost ? window->DockNodeAsHost : window->DockNode, window->DockNodeAsHost ? "DockNodeAsHost" : "DockNode");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->RootWindowDockStop != window->RootWindow) NodeWindow(window->RootWindowDockStop, "RootWindowDockStop");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }

        static void NodeWindowSettings(ImGuiWindowSettings* settings)
        {
            ImGui::Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",
                settings->ID, settings->GetName(), settings->Pos.x, settings->Pos.y, settings->Size.x, settings->Size.y, settings->Collapsed);
        }

        static void NodeViewport(ImGuiViewportP* viewport)
        {
            ImGui::SetNextItemOpen(true, ImGuiCond_Once);
            if (ImGui::TreeNode((void*)(intptr_t)viewport->ID, "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"", viewport->Idx, viewport->ID, viewport->ParentViewportId, viewport->Window ? viewport->Window->Name : "N/A"))
            {
                ImGuiWindowFlags flags = viewport->Flags;
                ImGui::BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%",
                    viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
                    viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y,
                    viewport->PlatformMonitor, viewport->DpiScale * 100.0f);
                if (viewport->Idx > 0) { ImGui::SameLine(); if (ImGui::SmallButton("Reset Pos")) { viewport->Pos = ImVec2(200,200); if (viewport->Window) viewport->Window->Pos = ImVec2(200,200); } }
                ImGui::BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s", viewport->Flags,
                    (flags & ImGuiViewportFlags_CanHostOtherWindows) ? " CanHostOtherWindows" : "", (flags & ImGuiViewportFlags_NoDecoration) ? " NoDecoration" : "",
                    (flags & ImGuiViewportFlags_NoFocusOnAppearing)  ? " NoFocusOnAppearing"  : "", (flags & ImGuiViewportFlags_NoInputs)     ? " NoInputs"     : "",
                    (flags & ImGuiViewportFlags_NoRendererClear)     ? " NoRendererClear"     : "", (flags & ImGuiViewportFlags_Minimized)    ? " Minimized"    : "",
                    (flags & ImGuiViewportFlags_NoAutoMerge)         ? " NoAutoMerge"         : "");
                for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                    for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                        Funcs::NodeDrawList(NULL, viewport, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
                ImGui::TreePop();
            }
        }

        static void NodeDockNode(ImGuiDockNode* node, const char* label)
        {
            ImGuiContext& g = *GImGui;
            const bool is_alive = (g.FrameCount - node->LastFrameAlive < 2);    // Submitted with ImGuiDockNodeFlags_KeepAliveOnly
            const bool is_active = (g.FrameCount - node->LastFrameActive < 2);  // Submitted
            if (!is_alive) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            bool open;
            if (node->Windows.Size > 0)
                open = ImGui::TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %d windows (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", node->Windows.Size, node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
            else
                open = ImGui::TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %s split (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", (node->SplitAxis == ImGuiAxis_X) ? "horizontal" : (node->SplitAxis == ImGuiAxis_Y) ? "vertical" : "n/a", node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
            if (!is_alive) { PopStyleColor(); }
            if (is_active && ImGui::IsItemHovered())
                if (ImGuiWindow* window = node->HostWindow ? node->HostWindow : node->VisibleWindow)
                    GetForegroundDrawList(window)->AddRect(node->Pos, node->Pos + node->Size, IM_COL32(255, 255, 0, 255));
            if (open)
            {
                IM_ASSERT(node->ChildNodes[0] == NULL || node->ChildNodes[0]->ParentNode == node);
                IM_ASSERT(node->ChildNodes[1] == NULL || node->ChildNodes[1]->ParentNode == node);
                ImGui::BulletText("Pos (%.0f,%.0f), Size (%.0f, %.0f) Ref (%.0f, %.0f)",
                    node->Pos.x, node->Pos.y, node->Size.x, node->Size.y, node->SizeRef.x, node->SizeRef.y);
                NodeWindow(node->HostWindow, "HostWindow");
                NodeWindow(node->VisibleWindow, "VisibleWindow");
                ImGui::BulletText("SelectedTabID: 0x%08X, LastFocusedNodeID: 0x%08X", node->SelectedTabId, node->LastFocusedNodeId);
                ImGui::BulletText("Misc:%s%s%s%s%s",
                    node->IsDockSpace() ? " IsDockSpace" : "",
                    node->IsCentralNode() ? " IsCentralNode" : "",
                    is_alive ? " IsAlive" : "", is_active ? " IsActive" : "",
                    node->WantLockSizeOnce ? " WantLockSizeOnce" : "");
                if (ImGui::TreeNode("flags", "LocalFlags: 0x%04X SharedFlags: 0x%04X", node->LocalFlags, node->SharedFlags))
                {
                    ImGui::CheckboxFlags("LocalFlags: NoDocking", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoDocking);
                    ImGui::CheckboxFlags("LocalFlags: NoSplit", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoSplit);
                    ImGui::CheckboxFlags("LocalFlags: NoResize", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResize);
                    ImGui::CheckboxFlags("LocalFlags: NoResizeX", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResizeX);
                    ImGui::CheckboxFlags("LocalFlags: NoResizeY", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResizeY);
                    ImGui::CheckboxFlags("LocalFlags: NoTabBar", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoTabBar);
                    ImGui::CheckboxFlags("LocalFlags: HiddenTabBar", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_HiddenTabBar);
                    ImGui::CheckboxFlags("LocalFlags: NoWindowMenuButton", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoWindowMenuButton);
                    ImGui::CheckboxFlags("LocalFlags: NoCloseButton", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoCloseButton);
                    ImGui::TreePop();
                }
                if (node->ParentNode)
                    NodeDockNode(node->ParentNode, "ParentNode");
                if (node->ChildNodes[0])
                    NodeDockNode(node->ChildNodes[0], "Child[0]");
                if (node->ChildNodes[1])
                    NodeDockNode(node->ChildNodes[1], "Child[1]");
                if (node->TabBar)
                    NodeTabBar(node->TabBar);
                ImGui::TreePop();
            }
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            const bool is_active = (tab_bar->PrevFrameVisible >= ImGui::GetFrameCount() - 2);
            p += ImFormatString(p, buf_end - p, "Tab Bar 0x%08X (%d tabs)%s", tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
            p += ImFormatString(p, buf_end - p, "  { ");
            for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
            {
                ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                p += ImFormatString(p, buf_end - p, "%s'%s'",
                    tab_n > 0 ? ", " : "", (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
            }
            p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            bool open = ImGui::TreeNode(tab_bar, "%s", buf);
            if (!is_active) { PopStyleColor(); }
            if (is_active && ImGui::IsItemHovered())
            {
                ImDrawList* draw_list = ImGui::GetForegroundDrawList();
                draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
            }
            if (open)
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                        tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }

        static void NodeStorage(ImGuiStorage* storage, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
                return;
            for (int n = 0; n < storage->Data.Size; n++)
            {
                const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
                ImGui::BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
            }
            ImGui::TreePop();
        }
    };

    // Tools
    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();
        ImGui::SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show mesh when hovering ImDrawCmd", &show_drawcmd_mesh);
        ImGui::Checkbox("Show bounding boxes when hovering ImDrawCmd", &show_drawcmd_aabb);
        ImGui::TreePop();
    }

    // Contents
    Funcs::NodeWindows(g.Windows, "Windows");
    //Funcs::NodeWindows(g.WindowsFocusOrder, "WindowsFocusOrder");
    if (ImGui::TreeNode("Viewport", "Viewports (%d)", g.Viewports.Size))
    {
        ImGui::Indent(ImGui::GetTreeNodeToLabelSpacing());
        ImGui::ShowViewportThumbnails();
        ImGui::Unindent(ImGui::GetTreeNodeToLabelSpacing());
        bool open = ImGui::TreeNode("Monitors", "Monitors (%d)", g.PlatformIO.Monitors.Size);
        ImGui::SameLine();
        MetricsHelpMarker("Dear ImGui uses monitor data:\n- to query DPI settings on a per monitor basis\n- to position popup/tooltips so they don't straddle monitors.");
        if (open)
        {
            for (int i = 0; i < g.PlatformIO.Monitors.Size; i++)
            {
                const ImGuiPlatformMonitor& mon = g.PlatformIO.Monitors[i];
                ImGui::BulletText("Monitor #%d: DPI %.0f%%\n MainMin (%.0f,%.0f), MainMax (%.0f,%.0f), MainSize (%.0f,%.0f)\n WorkMin (%.0f,%.0f), WorkMax (%.0f,%.0f), WorkSize (%.0f,%.0f)",
                    i, mon.DpiScale * 100.0f,
                    mon.MainPos.x, mon.MainPos.y, mon.MainPos.x + mon.MainSize.x, mon.MainPos.y + mon.MainSize.y, mon.MainSize.x, mon.MainSize.y,
                    mon.WorkPos.x, mon.WorkPos.y, mon.WorkPos.x + mon.WorkSize.x, mon.WorkPos.y + mon.WorkSize.y, mon.WorkSize.x, mon.WorkSize.y);
            }
            ImGui::TreePop();
        }
        for (int i = 0; i < g.Viewports.Size; i++)
            Funcs::NodeViewport(g.Viewports[i]);
        ImGui::TreePop();
    }

    // Details for Popups
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    // Details for TabBars
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
    IM_UNUSED(show_tables_rects);
    IM_UNUSED(show_tables_rect_type);
#ifdef IMGUI_HAS_TABLE
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            Funcs::NodeTable(g.Tables.GetByIndex(n));
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (ImGui::TreeNode("Dock nodes"))
    {
        static bool root_nodes_only = true;
        ImGuiDockContext* dc = &g.DockContext;
        ImGui::Checkbox("List root nodes", &root_nodes_only);
        ImGui::Checkbox("Ctrl shows window dock info", &show_docking_nodes);
        if (ImGui::SmallButton("Clear nodes")) { DockContextClearNodes(&g, 0, true); }
        ImGui::SameLine();
        if (ImGui::SmallButton("Rebuild all")) { dc->WantFullRebuild = true; }
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (!root_nodes_only || node->IsRootNode())
                    Funcs::NodeDockNode(node, "Node");
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (ImGui::TreeNode("Settings"))
    {
        if (ImGui::SmallButton("Clear"))
            ImGui::ClearIniSettings();
        ImGui::SameLine();
        if (ImGui::SmallButton("Save to memory"))
            ImGui::SaveIniSettingsToMemory();
        ImGui::SameLine();
        if (ImGui::SmallButton("Save to disk"))
            ImGui::SaveIniSettingsToDisk(g.IO.IniFilename);
        ImGui::SameLine();
        if (g.IO.IniFilename)
            ImGui::Text("\"%s\"", g.IO.IniFilename);
        else
            ImGui::TextUnformatted("<NULL>");
        ImGui::Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (ImGui::TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                ImGui::BulletText("%s", g.SettingsHandlers[n].TypeName);
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                Funcs::NodeWindowSettings(settings);
            ImGui::TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (ImGui::TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                Funcs::NodeTableSettings(settings);
            ImGui::TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
        if (ImGui::TreeNode("SettingsDocking", "Settings packed data: Docking"))
        {
            ImGuiDockContext* dc = &g.DockContext;
            ImGui::Text("In SettingsWindows:");
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                if (settings->DockId != 0)
                    ImGui::BulletText("Window '%s' -> DockId %08X", settings->GetName(), settings->DockId);
            ImGui::Text("In SettingsNodes:");
            for (int n = 0; n < dc->NodesSettings.Size; n++)
            {
                ImGuiDockNodeSettings* settings = &dc->NodesSettings[n];
                const char* selected_tab_name = NULL;
                if (settings->SelectedWindowId)
                {
                    if (ImGuiWindow* window = FindWindowByID(settings->SelectedWindowId))
                        selected_tab_name = window->Name;
                    else if (ImGuiWindowSettings* window_settings = FindWindowSettings(settings->SelectedWindowId))
                        selected_tab_name = window_settings->GetName();
                }
                ImGui::BulletText("Node %08X, Parent %08X, SelectedTab %08X ('%s')", settings->ID, settings->ParentNodeId, settings->SelectedWindowId, selected_tab_name ? selected_tab_name : settings->SelectedWindowId ? "N/A" : "");
            }
            ImGui::TreePop();
        }
#endif // #ifdef IMGUI_HAS_DOCK

        if (ImGui::TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            ImGui::InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, 0.0f), ImGuiInputTextFlags_ReadOnly);
            ImGui::TreePop();
        }
        ImGui::TreePop();
    }

    // Misc Details
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        ImGui::Text("WINDOWING");
        ImGui::Indent();
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        ImGui::Text("HoveredDockNode: 0x%08X", g.HoveredDockNode ? g.HoveredDockNode->ID : 0);
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("MouseViewport: 0x%08X (UserHovered 0x%08X, LastHovered 0x%08X)", g.MouseViewport->ID, g.IO.MouseHoveredViewport, g.MouseLastHoveredViewport ? g.MouseLastHoveredViewport->ID : 0);
        ImGui::Unindent();

        ImGui::Text("ITEMS");
        ImGui::Indent();
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::Unindent();

        ImGui::Text("NAV,FOCUS");
        ImGui::Indent();
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Unindent();

        ImGui::TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl && g.HoveredDockNode)
    {
        char buf[64] = "";
        char* p = buf;
        ImGuiDockNode* node = g.HoveredDockNode;
        ImDrawList* overlay_draw_list = node->HostWindow ? GetForegroundDrawList(node->HostWindow) : GetForegroundDrawList((ImGuiViewportP*)GetMainViewport());
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "DockId: %X%s\n", node->ID, node->IsCentralNode() ? " *CentralNode*" : "");
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "WindowClass: %08X\n", node->WindowClass.ClassId);
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "Size: (%.0f, %.0f)\n", node->Size.x, node->Size.y);
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "SizeRef: (%.0f, %.0f)\n", node->SizeRef.x, node->SizeRef.y);
        int depth = DockNodeGetDepth(node);
        overlay_draw_list->AddRect(node->Pos + ImVec2(3, 3) * (float)depth, node->Pos + node->Size - ImVec2(3, 3) * (float)depth, IM_COL32(200, 100, 100, 255));
        ImVec2 pos = node->Pos + ImVec2(3, 3) * (float)depth;
        overlay_draw_list->AddRectFilled(pos - ImVec2(1, 1), pos + CalcTextSize(buf) + ImVec2(1, 1), IM_COL32(200, 100, 100, 255));
        overlay_draw_list->AddText(NULL, 0.0f, pos, IM_COL32(255, 255, 255, 255), buf);
    }
#endif // #ifdef IMGUI_HAS_DOCK

    ImGui::End();
}